

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddEllipseFilled
          (ImDrawList *this,ImVec2 *center,float radius_x,float radius_y,ImU32 col,int num_segments)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  ImDrawList *in_RDI;
  float unaff_retaddr;
  float unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  float a_max;
  ImU32 in_stack_ffffffffffffffcc;
  
  if (((in_EDX & 0xff000000) != 0) && (2 < in_ECX)) {
    PathEllipticalArcTo(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                        (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),(int)((ulong)in_RSI >> 0x20))
    ;
    PathFillConvex(in_RDI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void ImDrawList::AddEllipseFilled(const ImVec2& center, float radius_x, float radius_y, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = IM_PI * 2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathEllipticalArcTo(center, radius_x, radius_y, 0.0f, a_max, num_segments - 1);
    PathFillConvex(col);
}